

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

double __thiscall icu_63::CalendarAstronomer::getJulianCentury(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  
  UVar1 = uprv_isNaN_63(this->julianCentury);
  if (UVar1 == '\0') {
    dVar2 = this->julianCentury;
  }
  else {
    UVar1 = uprv_isNaN_63(this->julianDay);
    if (UVar1 == '\0') {
      dVar2 = this->julianDay;
    }
    else {
      dVar2 = (this->fTime + 210866760000000.0) / 86400000.0;
      this->julianDay = dVar2;
    }
    dVar2 = (dVar2 + -2415020.0) / 36525.0;
    this->julianCentury = dVar2;
  }
  return dVar2;
}

Assistant:

double CalendarAstronomer::getJulianCentury() {
    if (isINVALID(julianCentury)) {
        julianCentury = (getJulianDay() - 2415020.0) / 36525.0;
    }
    return julianCentury;
}